

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

MemberInfo * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
          (Arena *this,MemberInfo *params,uint *params_1,Reader *params_2,StructOrGroup *params_3,
          bool *params_4)

{
  MemberInfo *location;
  MemberInfo *params_00;
  uint *params_1_00;
  Reader *params_2_00;
  StructOrGroup *params_3_00;
  bool *params_4_00;
  MemberInfo *result;
  bool *params_local_4;
  StructOrGroup *params_local_3;
  Reader *params_local_2;
  uint *params_local_1;
  MemberInfo *params_local;
  Arena *this_local;
  
  location = (MemberInfo *)allocateBytes(this,0x1a0,8,true);
  params_00 = fwd<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&>(params);
  params_1_00 = fwd<unsigned_int>(params_1);
  params_2_00 = fwd<capnp::compiler::Declaration::Reader&>(params_2);
  params_3_00 = fwd<capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&>(params_3);
  params_4_00 = fwd<bool>(params_4);
  ctor<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
            (location,params_00,params_1_00,params_2_00,params_3_00,params_4_00);
  setDestructor(this,location,
                destroyObject<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}